

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_geometry.cpp
# Opt level: O3

void __thiscall
ON_ModelGeometryComponent::Dump(ON_ModelGeometryComponent *this,ON_TextLog *text_log)

{
  element_type *this_00;
  ON_Object *this_01;
  ON_UserData *pOVar1;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,text_log);
  ON_TextLog::Print(text_log,"Attributes:\n");
  ON_TextLog::PushIndent(text_log);
  this_00 = (this->m_attributes_sp).
            super___shared_ptr<ON_3dmObjectAttributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    ON_TextLog::Print(text_log,"Unset\n");
  }
  else {
    (*(this_00->super_ON_Object)._vptr_ON_Object[7])(this_00,text_log);
    for (pOVar1 = ON_Object::FirstUserData(&this_00->super_ON_Object); pOVar1 != (ON_UserData *)0x0;
        pOVar1 = ON_UserData::Next(pOVar1)) {
      ON_TextLog::Print(text_log,"Attributes user data:\n");
      ON_TextLog::PushIndent(text_log);
      (*(pOVar1->super_ON_Object)._vptr_ON_Object[7])(pOVar1,text_log);
      ON_TextLog::PopIndent(text_log);
    }
  }
  ON_TextLog::PopIndent(text_log);
  ON_TextLog::Print(text_log,"Geometry:\n");
  ON_TextLog::PushIndent(text_log);
  this_01 = &((this->m_geometry_sp).super___shared_ptr<ON_Geometry,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ON_Object;
  if (this_01 == (ON_Object *)0x0) {
    ON_TextLog::Print(text_log,"Unset\n");
  }
  else {
    (*this_01->_vptr_ON_Object[7])(this_01,text_log);
    for (pOVar1 = ON_Object::FirstUserData(this_01); pOVar1 != (ON_UserData *)0x0;
        pOVar1 = ON_UserData::Next(pOVar1)) {
      ON_TextLog::Print(text_log,"Geometry user data:\n");
      ON_TextLog::PushIndent(text_log);
      (*(pOVar1->super_ON_Object)._vptr_ON_Object[7])(pOVar1,text_log);
      ON_TextLog::PopIndent(text_log);
    }
  }
  ON_TextLog::PopIndent(text_log);
  return;
}

Assistant:

void ON_ModelGeometryComponent::Dump( ON_TextLog& text_log ) const
{
  ON_ModelComponent::Dump(text_log);

  text_log.Print("Attributes:\n");
  text_log.PushIndent();
  const ON_3dmObjectAttributes* attributes = Attributes(nullptr);
  if (nullptr == attributes)
    text_log.Print("Unset\n");
  else
  {
    attributes->Dump(text_log);
    // attributes user data
    const ON_UserData* ud = attributes->FirstUserData();
    while (0 != ud)
    {
      text_log.Print("Attributes user data:\n");
      text_log.PushIndent();
      ud->Dump(text_log);
      text_log.PopIndent();
      ud = ud->Next();
    }
  }
  text_log.PopIndent();

  text_log.Print("Geometry:\n");
  text_log.PushIndent();
  const ON_Object* geometry = Geometry(nullptr);
  if (nullptr == geometry)
    text_log.Print("Unset\n");
  else
  {
    geometry->Dump(text_log);
    // geometry user data
    const ON_UserData* ud = geometry->FirstUserData();
    while (0 != ud)
    {
      text_log.Print("Geometry user data:\n");
      text_log.PushIndent();
      ud->Dump(text_log);
      text_log.PopIndent();
      ud = ud->Next();
    }
  }
  text_log.PopIndent();
}